

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

void * thread_fn(void *arg)

{
  uint uVar1;
  
  sx_semaphore_post((sx_sem *)arg,1);
  uVar1 = (**(code **)((long)arg + 0x80))
                    (*(undefined8 *)((long)arg + 0x90),*(undefined8 *)((long)arg + 0x98));
  return (void *)(ulong)uVar1;
}

Assistant:

static void* thread_fn(void* arg)
{
    sx_thread* thrd = (sx_thread*)arg;
    union {
        void* ptr;
        int32_t i;
    } cast;

#    if SX_PLATFORM_APPLE
    if (thrd->name[0])
        sx_thread_setname(thrd, thrd->name);
#    endif

    sx_semaphore_post(&thrd->sem, 1);
    cast.i = thrd->callback(thrd->user_data1, thrd->user_data2);
    return cast.ptr;
}